

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQuatSetRotation.cpp
# Opt level: O0

void anon_unknown.dwarf_7d43e::randomVectors(void)

{
  ostream *this;
  V3f to;
  V3f from;
  int i;
  Rand48 rand;
  V3f *in_stack_00000078;
  V3f *in_stack_00000080;
  unsigned_long in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  Vec3<float> *in_stack_ffffffffffffffc8;
  Rand48 *in_stack_ffffffffffffffd0;
  Rand48 *in_stack_ffffffffffffffe8;
  int local_c;
  
  this = std::operator<<((ostream *)&std::cout,"  random from and to vectors");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8);
  for (local_c = 0; local_c < 500000; local_c = local_c + 1) {
    Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>(in_stack_ffffffffffffffe8)
    ;
    Imath_2_5::Rand48::nextf
              (in_stack_ffffffffffffffd0,(double)in_stack_ffffffffffffffc8,
               (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    Imath_2_5::Vec3<float>::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    Imath_2_5::hollowSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand48>(in_stack_ffffffffffffffe8)
    ;
    Imath_2_5::Rand48::nextf
              (in_stack_ffffffffffffffd0,(double)in_stack_ffffffffffffffc8,
               (double)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    Imath_2_5::Vec3<float>::operator*(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    testRotation(in_stack_00000080,in_stack_00000078);
  }
  return;
}

Assistant:

void
randomVectors ()
{
    cout << "  random from and to vectors" << endl;

    Rand48 rand (17);

    for (int i = 0; i < 500000; ++i)
    {
	V3f from = hollowSphereRand<V3f> (rand) * rand.nextf (0.1, 10.0);
	V3f to = hollowSphereRand<V3f> (rand) * rand.nextf (0.1, 10.0);
	testRotation (from, to);
    }
}